

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_memory_usage.cpp
# Opt level: O1

void kokkosp_deallocate_data(SpaceHandle space,char *label,void *ptr,uint64_t size)

{
  int iVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  undefined1 *__s1;
  int iVar7;
  tuple<double,_unsigned_long,_double> tStack_d8;
  rusage rStack_c0;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)KokkosTools::MemoryUsage::m);
  if (iVar1 != 0) {
    uVar4 = std::__throw_system_error(iVar1);
    pthread_mutex_unlock((pthread_mutex_t *)KokkosTools::MemoryUsage::m);
    _Unwind_Resume(uVar4);
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  iVar1 = KokkosTools::MemoryUsage::num_spaces;
  lVar3 = lVar3 - KokkosTools::MemoryUsage::timer;
  lVar6 = (long)KokkosTools::MemoryUsage::num_spaces;
  iVar7 = KokkosTools::MemoryUsage::num_spaces;
  if (0 < lVar6) {
    __s1 = KokkosTools::MemoryUsage::space_name;
    lVar5 = 0;
    do {
      iVar2 = strcmp(__s1,space.name);
      if (iVar2 == 0) {
        iVar7 = (int)lVar5;
      }
      lVar5 = lVar5 + 1;
      __s1 = __s1 + 0x40;
    } while (lVar6 != lVar5);
  }
  if (iVar7 == iVar1) {
    strncpy(KokkosTools::MemoryUsage::space_name + lVar6 * 0x40,space.name,0x40);
    KokkosTools::MemoryUsage::num_spaces = iVar1 + 1;
  }
  lVar6 = (long)iVar7;
  if (size <= (ulong)(&KokkosTools::MemoryUsage::space_size)[lVar6]) {
    (&KokkosTools::MemoryUsage::space_size)[lVar6] =
         (&KokkosTools::MemoryUsage::space_size)[lVar6] - size;
    getrusage(RUSAGE_SELF,&rStack_c0);
    tStack_d8.super__Tuple_impl<0UL,_double,_unsigned_long,_double>.
    super__Tuple_impl<1UL,_unsigned_long,_double>.super__Tuple_impl<2UL,_double>.
    super__Head_base<2UL,_double,_false>._M_head_impl =
         (_Head_base<2UL,_double,_false>)((double)rStack_c0.ru_maxrss * 1024.0);
    tStack_d8.super__Tuple_impl<0UL,_double,_unsigned_long,_double>.
    super__Tuple_impl<1UL,_unsigned_long,_double>.super__Head_base<1UL,_unsigned_long,_false>.
    _M_head_impl = (&KokkosTools::MemoryUsage::space_size)[lVar6];
    tStack_d8.super__Tuple_impl<0UL,_double,_unsigned_long,_double>.
    super__Head_base<0UL,_double,_false>._M_head_impl = (double)lVar3 / 1000000000.0;
    std::
    vector<std::tuple<double,unsigned_long,double>,std::allocator<std::tuple<double,unsigned_long,double>>>
    ::emplace_back<std::tuple<double,unsigned_long,double>>
              ((vector<std::tuple<double,unsigned_long,double>,std::allocator<std::tuple<double,unsigned_long,double>>>
                *)(&KokkosTools::MemoryUsage::space_size_track + lVar6 * 3),&tStack_d8);
  }
  pthread_mutex_unlock((pthread_mutex_t *)KokkosTools::MemoryUsage::m);
  return;
}

Assistant:

void kokkosp_deallocate_data(const SpaceHandle space, const char* /*label*/,
                             const void* const /*ptr*/, const uint64_t size) {
  std::lock_guard<std::mutex> lock(m);

  double time = timer.seconds();

  int space_i = num_spaces;
  for (int s = 0; s < num_spaces; s++)
    if (strcmp(space_name[s], space.name) == 0) space_i = s;

  if (space_i == num_spaces) {
    strncpy(space_name[num_spaces], space.name, 64);
    num_spaces++;
  }
  if (space_size[space_i] >= size) {
    space_size[space_i] -= size;
    space_size_track[space_i].push_back(
        std::make_tuple(time, space_size[space_i], max_mem_usage()));
  }
}